

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::DistanceFinder::find
          (SelectionSet *__return_storage_ptr__,DistanceFinder *this,SelectionSet *bs,
          RealType distance)

{
  double *pdVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  double dVar4;
  pointer pOVar5;
  Snapshot *this_00;
  RigidBody *this_01;
  StuntDouble *pSVar6;
  pointer ppAVar7;
  Atom *pAVar8;
  bool bVar9;
  double dVar10;
  uint i;
  long lVar11;
  pointer ppSVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  uint i_8;
  pointer ppMVar17;
  pointer ppSVar18;
  long lVar19;
  pointer ppBVar20;
  pointer ppBVar21;
  pointer ppTVar22;
  pointer ppIVar23;
  int iVar24;
  pointer ppMVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  Vector<double,_3U> result;
  Vector3d centerPos;
  SelectionSet local_e8;
  Vector3d local_c8;
  Vector3d local_a8;
  RealType local_90;
  SelectionSet local_88;
  double local_68 [3];
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  this_00 = this->info_->sman_->currentSnapshot_;
  local_90 = distance;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ppSVar12 = (this->stuntdoubles_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppSVar18 = (this->stuntdoubles_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar18 != ppSVar12) {
    uVar27 = 0;
    uVar26 = 1;
    do {
      this_01 = (RigidBody *)ppSVar12[uVar27];
      if ((this_01 != (RigidBody *)0x0) && ((this_01->super_StuntDouble).objType_ == otRigidBody)) {
        RigidBody::updateAtoms(this_01);
        ppSVar12 = (this->stuntdoubles_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppSVar18 = (this->stuntdoubles_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar9 = uVar26 < (ulong)((long)ppSVar18 - (long)ppSVar12 >> 3);
      uVar27 = uVar26;
      uVar26 = (ulong)((int)uVar26 + 1);
    } while (bVar9);
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&local_88.bitsets_,&bs->bitsets_);
  SelectionSet::parallelReduce(&local_e8,&local_88);
  local_c8.super_Vector<double,_3U>.data_[2] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.super_Vector<double,_3U>.data_[1] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super_Vector<double,_3U>.data_[0] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_c8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_e8.bitsets_);
  lVar11 = (long)((local_88.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)->bitset_).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p;
  if (((long)((local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p - lVar11) * 8 +
      (ulong)((local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset != 0) {
    uVar27 = 0;
    do {
      iVar28 = (int)uVar27;
      iVar24 = iVar28 + 0x3f;
      if (-1 < iVar28) {
        iVar24 = iVar28;
      }
      local_50 = uVar27;
      if ((*(ulong *)(lVar11 + (long)(iVar24 >> 6) * 8 + -8 +
                     (ulong)(((long)iVar28 & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
           (uVar27 & 0x3f) & 1) != 0) {
        ppSVar12 = (this->stuntdoubles_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pSVar6 = ppSVar12[uVar27];
        lVar11 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
        local_68[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar11 + (long)pSVar6->localIndex_ * 0x18);
        local_68[0] = *pdVar1;
        local_68[1] = pdVar1[1];
        ppMVar17 = (this->molecules_).
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppMVar25 = (this->molecules_).
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar25 != ppMVar17) {
          uVar27 = 0;
          do {
            if (ppMVar17[uVar27] != (Molecule *)0x0) {
              Molecule::getCom(&local_a8,ppMVar17[uVar27]);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_68[lVar11] - local_a8.super_Vector<double,_3U>.data_[lVar11]);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this_00,&local_c8);
              dVar10 = 0.0;
              lVar11 = 0;
              do {
                dVar4 = local_c8.super_Vector<double,_3U>.data_[lVar11];
                dVar10 = dVar10 + dVar4 * dVar4;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar26 = uVar27 + 0x3f;
                if (-1 < (long)uVar27) {
                  uVar26 = uVar27;
                }
                puVar3 = (ulong *)(((long)uVar26 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
              }
              ppMVar17 = (this->molecules_).
                         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppMVar25 = (this->molecules_).
                         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)ppMVar25 - (long)ppMVar17 >> 3));
          ppSVar12 = (this->stuntdoubles_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        ppSVar18 = (this->stuntdoubles_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ppSVar18 != ppSVar12) {
          uVar27 = 0;
          do {
            pSVar6 = ppSVar12[uVar27];
            if (pSVar6 != (StuntDouble *)0x0) {
              lVar11 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_
                                );
              local_a8.super_Vector<double,_3U>.data_[2] =
                   (double)*(pointer *)(lVar11 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
              puVar2 = (undefined8 *)(lVar11 + (long)pSVar6->localIndex_ * 0x18);
              local_a8.super_Vector<double,_3U>.data_[0] = (double)*puVar2;
              local_a8.super_Vector<double,_3U>.data_[1] = (double)puVar2[1];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_68[lVar11] - local_a8.super_Vector<double,_3U>.data_[lVar11]);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this_00,&local_c8);
              dVar10 = 0.0;
              lVar11 = 0;
              do {
                dVar4 = local_c8.super_Vector<double,_3U>.data_[lVar11];
                dVar10 = dVar10 + dVar4 * dVar4;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar26 = uVar27 + 0x3f;
                if (-1 < (long)uVar27) {
                  uVar26 = uVar27;
                }
                puVar3 = (ulong *)(((long)uVar26 >> 6) * 8 +
                                   *(long *)&(((__return_storage_ptr__->bitsets_).
                                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
              }
              ppSVar12 = (this->stuntdoubles_).
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppSVar18 = (this->stuntdoubles_).
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)ppSVar18 - (long)ppSVar12 >> 3));
        }
        ppBVar13 = (this->bonds_).
                   super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppBVar20 = (this->bonds_).
                   super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (ppBVar20 != ppBVar13) {
          uVar27 = 0;
          do {
            if (ppBVar13[uVar27] != (Bond *)0x0) {
              ppAVar7 = (ppBVar13[uVar27]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pAVar8 = *ppAVar7;
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar19 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar19 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar8 = ppAVar7[1];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] * 0.5);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar26 = uVar27 + 0x3f;
                if (-1 < (long)uVar27) {
                  uVar26 = uVar27;
                }
                puVar3 = (ulong *)(((long)uVar26 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
              }
              ppBVar13 = (this->bonds_).
                         super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppBVar20 = (this->bonds_).
                         super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)ppBVar20 - (long)ppBVar13 >> 3));
        }
        ppBVar14 = (this->bends_).
                   super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppBVar21 = (this->bends_).
                   super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (ppBVar21 != ppBVar14) {
          uVar27 = 0;
          do {
            if (ppBVar14[uVar27] != (Bend *)0x0) {
              ppAVar7 = (ppBVar14[uVar27]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pAVar8 = *ppAVar7;
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar19 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar19 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar8 = ppAVar7[1];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar8 = ppAVar7[2];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] / 3.0);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar26 = uVar27 + 0x3f;
                if (-1 < (long)uVar27) {
                  uVar26 = uVar27;
                }
                puVar3 = (ulong *)(((long)uVar26 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
              }
              ppBVar14 = (this->bends_).
                         super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppBVar21 = (this->bends_).
                         super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)ppBVar21 - (long)ppBVar14 >> 3));
        }
        ppTVar15 = (this->torsions_).
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppTVar22 = (this->torsions_).
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        if (ppTVar22 != ppTVar15) {
          uVar27 = 0;
          do {
            if (ppTVar15[uVar27] != (Torsion *)0x0) {
              ppAVar7 = (ppTVar15[uVar27]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pAVar8 = *ppAVar7;
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar19 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar19 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar8 = ppAVar7[1];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar8 = ppAVar7[2];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar8 = ppAVar7[3];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] * 0.25);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar26 = uVar27 + 0x3f;
                if (-1 < (long)uVar27) {
                  uVar26 = uVar27;
                }
                puVar3 = (ulong *)(((long)uVar26 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
              }
              ppTVar15 = (this->torsions_).
                         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppTVar22 = (this->torsions_).
                         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)ppTVar22 - (long)ppTVar15 >> 3));
        }
        ppIVar16 = (this->inversions_).
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar23 = (this->inversions_).
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppIVar23 != ppIVar16) {
          uVar27 = 0;
          do {
            if (ppIVar16[uVar27] != (Inversion *)0x0) {
              ppAVar7 = (ppIVar16[uVar27]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pAVar8 = *ppAVar7;
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar19 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar19 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar8 = ppAVar7[1];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar8 = ppAVar7[2];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar8 = ppAVar7[3];
              lVar19 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar8->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar19 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] * 0.25);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar26 = uVar27 + 0x3f;
                if (-1 < (long)uVar27) {
                  uVar26 = uVar27;
                }
                puVar3 = (ulong *)(((long)uVar26 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[4].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
              }
              ppIVar16 = (this->inversions_).
                         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppIVar23 = (this->inversions_).
                         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)ppIVar23 - (long)ppIVar16 >> 3));
        }
      }
      uVar27 = local_50 + 1;
      lVar11 = (long)((local_88.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p;
    } while (uVar27 < (ulong)((local_88.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)((local_88.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      lVar11) * 8);
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_88.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms();
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
#ifdef IS_MPI

        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos();
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos();
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos();
            loc += bonds_[j]->getAtomB()->getPos();
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos();
            loc += bends_[j]->getAtomB()->getPos();
            loc += bends_[j]->getAtomC()->getPos();
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos();
            loc += torsions_[j]->getAtomB()->getPos();
            loc += torsions_[j]->getAtomC()->getPos();
            loc += torsions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos();
            loc += inversions_[j]->getAtomB()->getPos();
            loc += inversions_[j]->getAtomC()->getPos();
            loc += inversions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }